

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iLit1;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pRepr;
  int fDualOut_local;
  int fUseAll_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  pGVar5 = Gia_ManEquivRepr(p,pObj,fUseAll,fDualOut);
  if (pGVar5 == (Gia_Obj_t *)0x0) {
    if (pObj->Value == 0xffffffff) {
      iVar4 = Gia_ObjIsAnd(pObj);
      if (iVar4 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x270,
                      "void Gia_ManEquivReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                     );
      }
      pGVar5 = Gia_ObjFanin0(pObj);
      Gia_ManEquivReduce_rec(pNew,p,pGVar5,fUseAll,fDualOut);
      pGVar5 = Gia_ObjFanin1(pObj);
      Gia_ManEquivReduce_rec(pNew,p,pGVar5,fUseAll,fDualOut);
      iVar4 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar3 = Gia_ManHashAnd(pNew,iVar4,iLit1);
      pObj->Value = uVar3;
    }
  }
  else {
    Gia_ManEquivReduce_rec(pNew,p,pGVar5,fUseAll,fDualOut);
    uVar3 = pGVar5->Value;
    uVar1 = Gia_ObjPhaseReal(pGVar5);
    uVar2 = Gia_ObjPhaseReal(pObj);
    uVar3 = Abc_LitNotCond(uVar3,uVar1 ^ uVar2);
    pObj->Value = uVar3;
  }
  return;
}

Assistant:

void Gia_ManEquivReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ManEquivRepr(p, pObj, fUseAll, fDualOut)) )
    {
        Gia_ManEquivReduce_rec( pNew, p, pRepr, fUseAll, fDualOut );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin0(pObj), fUseAll, fDualOut );
    Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin1(pObj), fUseAll, fDualOut );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}